

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O3

int QSslCertificate::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  byte bVar1;
  QTlsBackend *pQVar2;
  code *pcVar3;
  QLoggingCategory *pQVar4;
  long lVar5;
  size_t siglen_00;
  size_t siglen_01;
  uchar *sig_00;
  
  sig_00 = sig;
  pQVar2 = QTlsBackend::activeOrAnyBackend();
  if (pQVar2 == (QTlsBackend *)0x0) {
    pQVar4 = QtPrivateLogging::lcSsl();
    bVar1 = *(byte *)((long)&pQVar4->field_2 + 1);
    if ((bVar1 & 1) != 0) {
      verify((EVP_PKEY_CTX *)pQVar4,sig_00,siglen_00,
             (uchar *)CONCAT71((int7)((ulong)tbs >> 8),bVar1),tbslen);
    }
  }
  else {
    lVar5 = *(long *)pQVar2;
    pcVar3 = (code *)(**(code **)(lVar5 + 0xe0))(pQVar2);
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)(ctx,sig,siglen);
      goto LAB_001cc5a4;
    }
    pQVar4 = QtPrivateLogging::lcSsl();
    bVar1 = *(byte *)((long)&pQVar4->field_2 + 1);
    if ((bVar1 & 1) != 0) {
      verify((EVP_PKEY_CTX *)pQVar4,sig_00,siglen_01,
             (uchar *)CONCAT71((int7)((ulong)lVar5 >> 8),bVar1),tbslen);
    }
  }
  *(undefined8 *)ctx = 0;
  *(undefined8 *)(ctx + 8) = 0;
  *(undefined8 *)(ctx + 0x10) = 0;
LAB_001cc5a4:
  return (int)ctx;
}

Assistant:

QList<QSslError> QSslCertificate::verify(const QList<QSslCertificate> &certificateChain, const QString &hostName)
{
    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return {};
    }
    auto verifyPtr = tlsBackend->X509Verifier();
    if (!verifyPtr) {
        qCWarning(lcSsl, "Available TLS backend does not support manual certificate verification");
        return {};
    }
    return verifyPtr(certificateChain, hostName);
}